

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool array_container_is_subset(array_container_t *container1,array_container_t *container2)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  
  uVar1 = container1->cardinality;
  uVar2 = 0;
  if ((int)uVar1 <= container2->cardinality) {
    for (lVar3 = 0; ((int)uVar2 < (int)uVar1 && (lVar3 < container2->cardinality));
        lVar3 = lVar3 + 1) {
      if (container1->array[(int)uVar2] == container2->array[lVar3]) {
        uVar2 = uVar2 + 1;
      }
      else if (container1->array[(int)uVar2] <= container2->array[lVar3]) {
        return false;
      }
    }
    uVar2 = (uint)(uVar2 == uVar1);
  }
  return SUB41(uVar2,0);
}

Assistant:

bool array_container_is_subset(const array_container_t *container1,
                               const array_container_t *container2) {
    if (container1->cardinality > container2->cardinality) {
        return false;
    }
    int i1 = 0, i2 = 0;
    while (i1 < container1->cardinality && i2 < container2->cardinality) {
        if (container1->array[i1] == container2->array[i2]) {
            i1++;
            i2++;
        } else if (container1->array[i1] > container2->array[i2]) {
            i2++;
        } else {  // container1->array[i1] < container2->array[i2]
            return false;
        }
    }
    if (i1 == container1->cardinality) {
        return true;
    } else {
        return false;
    }
}